

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O1

void __thiscall
agge::tests::PathStrokeTests::HorizontalLineIsTransformedToARect(PathStrokeTests *this)

{
  cap *pcVar1;
  stroke s;
  undefined1 local_1e8 [8];
  int local_1e0;
  point local_1dc;
  undefined8 local_1d0;
  int local_1c8;
  point local_1c4;
  real_t rStack_1b8;
  real_t rStack_1b4;
  int iStack_1b0;
  point local_1ac;
  point local_198;
  undefined8 local_18c;
  undefined4 local_184;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 local_174;
  undefined4 local_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined8 local_15c;
  undefined4 local_154;
  stroke local_150;
  undefined1 local_f8 [44];
  int local_cc;
  pointer local_c8;
  int local_c0;
  pointer local_bc;
  int local_b4;
  point local_a8;
  point local_9c;
  point local_90;
  point local_84;
  point local_78;
  point local_6c;
  string local_58;
  LocationInfo local_38;
  
  stroke::stroke(&local_150);
  stroke::width(&local_150,2.1);
  pcVar1 = (cap *)operator_new(8);
  pcVar1->_vptr_cap = (_func_int **)&PTR__cap_001c2288;
  if (local_150._cap != (cap *)0x0) {
    (*(local_150._cap)->_vptr_cap[1])();
  }
  local_150._cap = pcVar1;
  stroke::add_vertex(&local_150,1.3,5.81,1);
  stroke::add_vertex(&local_150,7.1,5.81,2);
  local_198.command = 0;
  local_198.x = 0.0;
  local_198.y = 0.0;
  local_a8.command = stroke::vertex(&local_150,&local_198.x,&local_198.y);
  local_a8.x = local_198.x;
  local_a8.y = local_198.y;
  local_198.command = 0;
  local_198.x = 0.0;
  local_198.y = 0.0;
  local_9c.command = stroke::vertex(&local_150,&local_198.x,&local_198.y);
  local_9c.x = local_198.x;
  local_9c.y = local_198.y;
  local_198.command = 0;
  local_198.x = 0.0;
  local_198.y = 0.0;
  local_90.command = stroke::vertex(&local_150,&local_198.x,&local_198.y);
  local_90.x = local_198.x;
  local_90.y = local_198.y;
  local_198.command = 0;
  local_198.x = 0.0;
  local_198.y = 0.0;
  local_84.command = stroke::vertex(&local_150,&local_198.x,&local_198.y);
  local_84.x = local_198.x;
  local_84.y = local_198.y;
  local_198.command = 0;
  local_198.x = 0.0;
  local_198.y = 0.0;
  local_78.command = stroke::vertex(&local_150,&local_198.x,&local_198.y);
  local_78.x = local_198.x;
  local_78.y = local_198.y;
  local_198.command = 0;
  local_198.x = 0.0;
  local_198.y = 0.0;
  local_6c.command = stroke::vertex(&local_150,&local_198.x,&local_198.y);
  local_6c.x = local_198.x;
  local_6c.y = local_198.y;
  local_198.x = 1.3;
  local_198.y = 6.86;
  local_198.command = 1;
  local_18c = 0x409851ec3fa66666;
  local_184 = 2;
  local_180 = 0x409851ec40e33333;
  local_178 = 2;
  local_174 = 0x40db851f40e33333;
  local_16c = 2;
  uStack_168 = 0;
  uStack_164 = 0;
  uStack_160 = 0x30;
  local_15c = 0;
  local_154 = 0;
  local_1e8 = (undefined1  [8])&local_1dc.y;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_f8,(string *)local_1e8,0x6d);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])&local_198,(point (*) [6])&local_a8,(LocationInfo *)local_f8);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  if (local_1e8 != (undefined1  [8])&local_1dc.y) {
    operator_delete((void *)local_1e8);
  }
  stroke::width(&local_150,1.5);
  stroke::remove_all(&local_150);
  stroke::add_vertex(&local_150,108.3,-15.1,1);
  stroke::add_vertex(&local_150,-5.0,-15.1,2);
  local_1e0 = 0;
  local_1e8 = (undefined1  [8])0x0;
  local_f8._8_4_ = stroke::vertex(&local_150,(real_t *)local_1e8,(real_t *)(local_1e8 + 4));
  local_f8._0_8_ = local_1e8;
  local_1e0 = 0;
  local_1e8 = (undefined1  [8])0x0;
  local_f8._20_4_ = stroke::vertex(&local_150,(real_t *)local_1e8,(real_t *)(local_1e8 + 4));
  local_f8._12_8_ = local_1e8;
  local_1e0 = 0;
  local_1e8 = (undefined1  [8])0x0;
  local_f8._32_4_ = stroke::vertex(&local_150,(real_t *)local_1e8,(real_t *)(local_1e8 + 4));
  local_f8._24_8_ = local_1e8;
  local_1e0 = 0;
  local_1e8 = (undefined1  [8])0x0;
  local_cc = stroke::vertex(&local_150,(real_t *)local_1e8,(real_t *)(local_1e8 + 4));
  local_f8._36_8_ = local_1e8;
  local_1e0 = 0;
  local_1e8 = (undefined1  [8])0x0;
  local_c0 = stroke::vertex(&local_150,(real_t *)local_1e8,(real_t *)(local_1e8 + 4));
  local_c8 = (pointer)local_1e8;
  local_1e0 = 0;
  local_1e8 = (undefined1  [8])0x0;
  local_b4 = stroke::vertex(&local_150,(real_t *)local_1e8,(real_t *)(local_1e8 + 4));
  local_bc = (pointer)local_1e8;
  local_1e8 = (undefined1  [8])0xc17d999a42d8999a;
  local_1e0 = 1;
  local_1dc.x = 108.3;
  local_1dc.y = -14.35;
  local_1dc.command = 2;
  local_1d0 = 0xc165999ac0a00000;
  local_1c8 = 2;
  local_1c4.x = -5.0;
  local_1c4.y = -15.85;
  local_1c4.command = 2;
  rStack_1b8 = 0.0;
  rStack_1b4 = 0.0;
  iStack_1b0 = 0x30;
  local_1ac.x = 0.0;
  local_1ac.y = 0.0;
  local_1ac.command = 0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_38,&local_58,0x80);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_1e8,(point (*) [6])local_f8,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.filename._M_dataplus._M_p != &local_38.filename.field_2) {
    operator_delete(local_38.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  stroke::~stroke(&local_150);
  return;
}

Assistant:

test( HorizontalLineIsTransformedToARect )
			{
				// INIT
				stroke s;

				s.width(2.1f);
				s.set_cap(caps::butt());

				// ACT
				move_to(s, 1.3f, 5.81f);
				line_to(s, 7.1f, 5.81f);
				mocks::path::point points1[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(1.3f, 6.86f), lineto(1.3f, 4.76f),
					lineto(7.1f, 4.76f), lineto(7.1f, 6.86f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.width(1.5f);
				s.remove_all();

				// ACT
				move_to(s, 108.3f, -15.1f);
				line_to(s, -5.0f, -15.1f);
				mocks::path::point points2[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(108.3f, -15.85f), lineto(108.3f, -14.35f),
					lineto(-5.0f, -14.35f), lineto(-5.0f, -15.85f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}